

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

uint32_t nni_msg_trim_u32(nni_msg *m)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  byte *pbVar6;
  
  uVar5 = (m->m_body).ch_len;
  if (uVar5 < 4) {
    nni_panic("%s: %d: assert err: %s",
              "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/message.c",
              0x13f,"ch->ch_len >= sizeof(v)");
    uVar5 = (m->m_body).ch_len;
    pbVar6 = (m->m_body).ch_ptr;
    bVar4 = *pbVar6;
    bVar3 = pbVar6[1];
    bVar2 = pbVar6[2];
    bVar1 = pbVar6[3];
    if (uVar5 < 4) goto LAB_00112d05;
  }
  else {
    pbVar6 = (m->m_body).ch_ptr;
    bVar4 = *pbVar6;
    bVar3 = pbVar6[1];
    bVar2 = pbVar6[2];
    bVar1 = pbVar6[3];
  }
  (m->m_body).ch_len = uVar5 - 4;
  if (uVar5 != 4) {
    (m->m_body).ch_ptr = pbVar6 + 4;
  }
LAB_00112d05:
  return (uint)bVar1 | (uint)bVar2 << 8 | (uint)bVar3 << 0x10 | (uint)bVar4 << 0x18;
}

Assistant:

uint32_t
nni_msg_trim_u32(nni_msg *m)
{
	return (nni_chunk_trim_u32(&m->m_body));
}